

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution1D_x86_avx512::create_pipeline(Convolution1D_x86_avx512 *this,Option *opt)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int *piVar4;
  Allocator *pAVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  void *pvVar16;
  void *pvVar17;
  int k;
  uint uVar18;
  int iVar19;
  long lVar20;
  void *pvVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  int k_3;
  void *pvVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  long lVar31;
  void *pvVar32;
  int iVar33;
  void *pvVar34;
  ulong uVar35;
  int k_4;
  uint uVar36;
  void *pvVar37;
  long lVar38;
  int iVar39;
  undefined1 (*pauVar40) [64];
  int iVar41;
  void *pvVar42;
  ulong uVar43;
  void *pvVar44;
  int iVar45;
  void *pvVar46;
  void *pvVar47;
  long lVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 in_ZMM3 [64];
  undefined1 in_ZMM4 [64];
  undefined1 auVar77 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  long local_100;
  int local_f8;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  
  if ((this->super_Convolution1D).dynamic_weight != 0) {
    return 0;
  }
  uVar3 = (this->super_Convolution1D).kernel_w;
  uVar43 = (long)(this->super_Convolution1D).weight_data_size / (long)(int)uVar3;
  uVar18 = (this->super_Convolution1D).num_output;
  lVar38 = (long)(int)uVar18;
  uVar43 = (long)((ulong)(uint)((int)uVar43 >> 0x1f) << 0x20 | uVar43 & 0xffffffff) /
           (long)(int)uVar18;
  uVar23 = uVar43 & 0xffffffff;
  uVar12 = (uint)uVar43;
  uVar24 = uVar12;
  if (lVar38 < 0x10) {
    if ((int)uVar18 < 8) {
      if ((int)uVar18 < 4) {
        if ((int)uVar18 < 2) {
          if ((int)uVar12 < 0x10) {
            if ((int)uVar12 < 8) {
              if ((int)uVar12 < 4) {
                uVar29 = uVar3;
                if (1 < (int)uVar12) {
                  uVar29 = uVar3 * 2;
                  uVar24 = (uVar12 & 1) + 1;
                }
              }
              else {
                uVar29 = uVar3 * 4;
                uVar24 = (uVar12 & 1) + 1 + (uint)((uVar12 >> 1 & 1) != 0);
              }
            }
            else {
              uVar29 = uVar3 * 8;
              uVar24 = (uVar12 & 1) + 1 + (uVar12 >> 2 & 1) + (uint)((uVar12 >> 1 & 1) != 0);
            }
          }
          else {
            uVar29 = uVar3 << 4;
            uVar24 = (uVar12 & 1) + (uVar12 >> 4) + (uint)((uVar12 >> 3 & 1) != 0) +
                     ((uint)(uVar23 >> 2) & 1) + (uint)((uVar12 >> 1 & 1) != 0);
          }
        }
        else {
          if ((int)uVar12 < 0x10) {
            if ((int)uVar12 < 8) {
              if ((int)uVar12 < 4) {
                if ((int)uVar12 < 2) {
                  uVar29 = uVar3 * 2;
                  uVar18 = (uVar18 & 1) + 1;
                  goto LAB_004cdafc;
                }
                uVar29 = uVar3 * 4;
                uVar24 = (uVar12 & 1) + 1;
              }
              else {
                uVar24 = (uVar12 & 1) + 1 + (uint)((uVar12 >> 1 & 1) != 0);
                uVar29 = uVar3 * 8;
              }
              uVar18 = (uVar18 & 1) + 1;
              goto LAB_004cdafc;
            }
            uVar29 = uVar3 << 4;
            uVar24 = (uVar12 & 1) + 1 + (uVar12 >> 2 & 1) + (uint)((uVar12 >> 1 & 1) != 0);
          }
          else {
            uVar29 = uVar3 << 5;
            uVar24 = (uVar12 & 1) + (uVar12 >> 4) + (uint)((uVar12 >> 3 & 1) != 0) +
                     ((uint)(uVar23 >> 2) & 1) + (uint)((uVar12 >> 1 & 1) != 0);
          }
          uVar18 = (uVar18 & 1) + 1;
        }
      }
      else {
        if ((int)uVar12 < 0x10) {
          if ((int)uVar12 < 8) {
            if ((int)uVar12 < 4) {
              if ((int)uVar12 < 2) {
                uVar29 = uVar3 * 4;
                uVar18 = (uVar18 & 1) + 1 + (uint)((uVar18 >> 1 & 1) != 0);
                goto LAB_004cdafc;
              }
              uVar29 = uVar3 * 8;
              uVar24 = (uVar12 & 1) + 1;
            }
            else {
              uVar29 = uVar3 << 4;
              uVar24 = (uVar12 & 1) + 1 + (uint)((uVar12 >> 1 & 1) != 0);
            }
            uVar18 = (uVar18 & 1) + 1 + (uint)((uVar18 >> 1 & 1) != 0);
            goto LAB_004cdafc;
          }
          uVar29 = uVar3 << 5;
          uVar24 = (uVar12 & 1) + 1 + (uVar12 >> 2 & 1) + (uint)((uVar12 >> 1 & 1) != 0);
        }
        else {
          uVar29 = uVar3 << 6;
          uVar24 = (uVar12 & 1) + (uVar12 >> 4) + (uint)((uVar12 >> 3 & 1) != 0) +
                   ((uint)(uVar23 >> 2) & 1) + (uint)((uVar12 >> 1 & 1) != 0);
        }
        uVar18 = (uVar18 & 1) + 1 + (uint)((uVar18 >> 1 & 1) != 0);
      }
    }
    else {
      if ((int)uVar12 < 0x10) {
        if ((int)uVar12 < 8) {
          if ((int)uVar12 < 4) {
            if ((int)uVar12 < 2) {
              uVar29 = uVar3 * 8;
              uVar18 = (uVar18 & 1) + 1 + (uVar18 >> 2 & 1) + (uint)((uVar18 >> 1 & 1) != 0);
              goto LAB_004cdafc;
            }
            uVar29 = uVar3 << 4;
            uVar24 = (uVar12 & 1) + 1;
          }
          else {
            uVar29 = uVar3 << 5;
            uVar24 = (uVar12 & 1) + 1 + (uint)((uVar12 >> 1 & 1) != 0);
          }
        }
        else {
          uVar29 = uVar3 << 6;
          uVar24 = (uVar12 & 1) + 1 + (uVar12 >> 2 & 1) + (uint)((uVar12 >> 1 & 1) != 0);
        }
      }
      else {
        uVar29 = uVar3 << 7;
        uVar24 = (uVar12 & 1) + (uVar12 >> 4) + (uint)((uVar12 >> 3 & 1) != 0) +
                 ((uint)(uVar23 >> 2) & 1) + (uint)((uVar12 >> 1 & 1) != 0);
      }
      uVar18 = (uVar18 & 1) + 1 + (uVar18 >> 2 & 1) + (uint)((uVar18 >> 1 & 1) != 0);
    }
  }
  else {
    if ((int)uVar12 < 0x10) {
      if ((int)uVar12 < 8) {
        if ((int)uVar12 < 4) {
          if ((int)uVar12 < 2) {
            uVar29 = uVar3 << 4;
            uVar18 = (uVar18 & 1) + (uVar18 >> 4) + (uint)((uVar18 >> 3 & 1) != 0) +
                     (uVar18 >> 2 & 1) + (uint)((uVar18 >> 1 & 1) != 0);
            goto LAB_004cdafc;
          }
          uVar29 = uVar3 << 5;
          uVar24 = (uVar12 & 1) + 1;
        }
        else {
          uVar29 = uVar3 << 6;
          uVar24 = (uVar12 & 1) + 1 + (uint)((uVar12 >> 1 & 1) != 0);
        }
      }
      else {
        uVar29 = uVar3 << 7;
        uVar24 = (uVar12 & 1) + 1 + (uVar12 >> 2 & 1) + (uint)((uVar12 >> 1 & 1) != 0);
      }
    }
    else {
      uVar29 = uVar3 << 8;
      uVar24 = (uVar12 & 1) + (uVar12 >> 4) + (uint)((uVar12 >> 3 & 1) != 0) +
               ((uint)(uVar23 >> 2) & 1) + (uint)((uVar12 >> 1 & 1) != 0);
    }
    uVar18 = (uVar18 & 1) + (uVar18 >> 4) + (uint)((uVar18 >> 3 & 1) != 0) + (uVar18 >> 2 & 1) +
             (uint)((uVar18 >> 1 & 1) != 0);
  }
LAB_004cdafc:
  Mat::create(&this->weight_data_tm,uVar29,uVar24,uVar18,4,(Allocator *)0x0);
  auVar53 = vpbroadcastd_avx512f();
  auVar53 = vpmulld_avx512f(auVar53,_DAT_00552fc0);
  auVar54 = vpbroadcastd_avx512f();
  vpmulld_avx512f(auVar54,auVar53);
  iVar14 = 0;
  uVar43 = 0;
  if (0 < (int)uVar3) {
    uVar43 = (ulong)uVar3;
  }
  iVar33 = uVar3 * uVar12;
  uVar36 = iVar33 * 0x10;
  uVar18 = iVar33 * 3;
  iVar45 = iVar33 * 2;
  iVar39 = iVar33 * 7;
  iVar28 = iVar33 * 6;
  iVar41 = iVar33 * 5;
  local_f8 = iVar33 * 4;
  lVar20 = (long)(int)(uVar3 << 4) * 4;
  lVar25 = (long)(int)(uVar3 * 8) * 4;
  lVar31 = (long)(int)(uVar3 * 4) * 4;
  lVar15 = (long)(int)(uVar3 * 2) * 4;
  iVar19 = iVar33 * 0xf;
  iVar13 = iVar33 * 0xe;
  uVar29 = iVar33 * 0xd;
  local_90 = iVar33 * 0xc;
  local_94 = iVar33 * 0xb;
  local_98 = iVar33 * 10;
  local_9c = iVar33 * 9;
  iVar30 = iVar33 * 8;
  lVar1 = uVar43 * 4;
  lVar2 = (long)(int)uVar3 * 4;
  uVar24 = uVar29;
  for (uVar23 = 0; pvVar47 = (void *)(ulong)uVar24, (long)(uVar23 | 0xf) < lVar38;
      uVar23 = uVar23 + 0x10) {
    pvVar17 = (this->super_Convolution1D).weight_data.data;
    local_60 = (void *)((long)iVar19 * 4 + (long)pvVar17);
    local_68 = (void *)((long)iVar13 * 4 + (long)pvVar17);
    local_70 = (void *)((long)(int)uVar29 * 4 + (long)pvVar17);
    local_78 = (void *)((long)local_90 * 4 + (long)pvVar17);
    local_80 = (void *)((long)local_94 * 4 + (long)pvVar17);
    local_88 = (void *)((long)local_98 * 4 + (long)pvVar17);
    pvVar44 = (void *)((long)local_9c * 4 + (long)pvVar17);
    pvVar42 = (void *)((long)iVar30 * 4 + (long)pvVar17);
    pvVar32 = (void *)((long)iVar39 * 4 + (long)pvVar17);
    pvVar46 = (void *)((long)iVar28 * 4 + (long)pvVar17);
    pvVar21 = (void *)((long)iVar41 * 4 + (long)pvVar17);
    pvVar16 = (void *)((long)local_f8 * 4 + (long)pvVar17);
    pvVar27 = (void *)((long)(int)uVar18 * 4 + (long)pvVar17);
    pvVar37 = (void *)((long)iVar45 * 4 + (long)pvVar17);
    pvVar34 = (void *)((long)iVar33 * 4 + (long)pvVar17);
    pvVar47 = (void *)((long)pvVar17 + (long)iVar14 * 4);
    local_100 = (long)iVar14 * 4 + lVar2 + (long)pvVar17;
    pauVar40 = (undefined1 (*) [64])
               ((uVar23 >> 4) * (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize +
               (long)(this->weight_data_tm).data);
    for (uVar24 = 0; (int)(uVar24 | 0xf) < (int)uVar12; uVar24 = uVar24 + 0x10) {
      for (lVar26 = 0; lVar1 - lVar26 != 0; lVar26 = lVar26 + 4) {
        auVar53 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar47 + (long)pvVar16 * 4 + lVar26));
        auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar34 + (long)pvVar16 * 4 + lVar26));
        auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar37 + (long)pvVar16 * 4 + lVar26));
        auVar56 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar27 + (long)pvVar16 * 4 + lVar26));
        auVar57 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar16 * 5 + lVar26));
        auVar58 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar21 + (long)pvVar16 * 4 + lVar26));
        auVar59 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar46 + (long)pvVar16 * 4 + lVar26));
        auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar32 + (long)pvVar16 * 4 + lVar26));
        auVar61 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar42 + (long)pvVar16 * 4 + lVar26));
        auVar62 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar44 + (long)pvVar16 * 4 + lVar26));
        auVar63 = vgatherdps_avx512f(*(undefined4 *)((long)local_88 + (long)pvVar16 * 4 + lVar26));
        auVar64 = vgatherdps_avx512f(*(undefined4 *)((long)local_80 + (long)pvVar16 * 4 + lVar26));
        auVar65 = vgatherdps_avx512f(*(undefined4 *)((long)local_78 + (long)pvVar16 * 4 + lVar26));
        auVar66 = vgatherdps_avx512f(*(undefined4 *)((long)local_70 + (long)pvVar16 * 4 + lVar26));
        vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        auVar67 = vgatherdps_avx512f(*(undefined4 *)((long)local_68 + (long)pvVar16 * 4 + lVar26));
        vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        auVar68 = vgatherdps_avx512f(*(undefined4 *)((long)local_60 + (long)pvVar16 * 4 + lVar26));
        auVar69 = vunpcklps_avx512f(auVar53,auVar54);
        auVar53 = vunpckhps_avx512f(auVar53,auVar54);
        auVar54 = vunpcklps_avx512f(auVar55,auVar56);
        auVar55 = vunpckhps_avx512f(auVar55,auVar56);
        auVar56 = vunpcklps_avx512f(auVar57,auVar58);
        auVar57 = vunpckhps_avx512f(auVar57,auVar58);
        auVar58 = vunpcklps_avx512f(auVar59,auVar60);
        auVar59 = vunpckhps_avx512f(auVar59,auVar60);
        auVar60 = vunpcklps_avx512f(auVar61,auVar62);
        auVar61 = vunpckhps_avx512f(auVar61,auVar62);
        auVar62 = vunpcklps_avx512f(auVar63,auVar64);
        auVar63 = vunpckhps_avx512f(auVar63,auVar64);
        auVar64 = vunpcklps_avx512f(auVar65,auVar66);
        auVar65 = vunpckhps_avx512f(auVar65,auVar66);
        auVar66 = vunpcklps_avx512f(auVar67,auVar68);
        auVar67 = vunpckhps_avx512f(auVar67,auVar68);
        auVar68 = vunpcklpd_avx512f(auVar69,auVar54);
        auVar54 = vunpckhpd_avx512f(auVar69,auVar54);
        auVar69 = vunpcklpd_avx512f(auVar53,auVar55);
        auVar53 = vunpckhpd_avx512f(auVar53,auVar55);
        auVar55 = vunpcklpd_avx512f(auVar56,auVar58);
        auVar56 = vunpckhpd_avx512f(auVar56,auVar58);
        auVar58 = vunpcklpd_avx512f(auVar57,auVar59);
        auVar57 = vunpckhpd_avx512f(auVar57,auVar59);
        auVar59 = vunpcklpd_avx512f(auVar60,auVar62);
        auVar60 = vunpckhpd_avx512f(auVar60,auVar62);
        auVar62 = vunpcklpd_avx512f(auVar61,auVar63);
        auVar61 = vunpckhpd_avx512f(auVar61,auVar63);
        auVar63 = vunpcklpd_avx512f(auVar64,auVar66);
        auVar64 = vunpckhpd_avx512f(auVar64,auVar66);
        auVar66 = vunpcklpd_avx512f(auVar65,auVar67);
        auVar65 = vunpckhpd_avx512f(auVar65,auVar67);
        auVar67 = vshuff64x2_avx512f(auVar68,auVar55,0x88);
        auVar70 = vshuff64x2_avx512f(auVar59,auVar63,0x88);
        auVar71 = vshuff64x2_avx512f(auVar54,auVar56,0x88);
        auVar72 = vshuff64x2_avx512f(auVar60,auVar64,0x88);
        auVar73 = vshuff64x2_avx512f(auVar69,auVar58,0x88);
        auVar74 = vshuff64x2_avx512f(auVar62,auVar66,0x88);
        auVar75 = vshuff64x2_avx512f(auVar53,auVar57,0x88);
        auVar76 = vshuff64x2_avx512f(auVar61,auVar65,0x88);
        auVar55 = vshuff64x2_avx512f(auVar68,auVar55,0xdd);
        auVar59 = vshuff64x2_avx512f(auVar59,auVar63,0xdd);
        auVar54 = vshuff64x2_avx512f(auVar54,auVar56,0xdd);
        auVar56 = vshuff64x2_avx512f(auVar60,auVar64,0xdd);
        auVar58 = vshuff64x2_avx512f(auVar69,auVar58,0xdd);
        auVar60 = vshuff64x2_avx512f(auVar62,auVar66,0xdd);
        auVar53 = vshuff64x2_avx512f(auVar53,auVar57,0xdd);
        auVar57 = vshuff64x2_avx512f(auVar61,auVar65,0xdd);
        auVar61 = vshuff64x2_avx512f(auVar67,auVar70,0x88);
        auVar62 = vshuff64x2_avx512f(auVar71,auVar72,0x88);
        auVar63 = vshuff64x2_avx512f(auVar73,auVar74,0x88);
        auVar64 = vshuff64x2_avx512f(auVar75,auVar76,0x88);
        auVar65 = vshuff64x2_avx512f(auVar55,auVar59,0x88);
        auVar66 = vshuff64x2_avx512f(auVar54,auVar56,0x88);
        in_ZMM17 = vshuff64x2_avx512f(auVar58,auVar60,0x88);
        auVar68 = vshuff64x2_avx512f(auVar53,auVar57,0x88);
        in_ZMM16 = vshuff64x2_avx512f(auVar67,auVar70,0xdd);
        auVar67 = vshuff64x2_avx512f(auVar71,auVar72,0xdd);
        auVar69 = vshuff64x2_avx512f(auVar73,auVar74,0xdd);
        auVar70 = vshuff64x2_avx512f(auVar75,auVar76,0xdd);
        in_ZMM4 = vshuff64x2_avx512f(auVar55,auVar59,0xdd);
        in_ZMM3 = vshuff64x2_avx512f(auVar54,auVar56,0xdd);
        in_ZMM5 = vshuff64x2_avx512f(auVar58,auVar60,0xdd);
        auVar53 = vshuff64x2_avx512f(auVar53,auVar57,0xdd);
        *pauVar40 = auVar61;
        pauVar40[1] = auVar62;
        pauVar40[2] = auVar63;
        pauVar40[3] = auVar64;
        pauVar40[4] = auVar65;
        pauVar40[5] = auVar66;
        pauVar40[6] = in_ZMM17;
        pauVar40[7] = auVar68;
        pauVar40[8] = in_ZMM16;
        pauVar40[9] = auVar67;
        pauVar40[10] = auVar69;
        pauVar40[0xb] = auVar70;
        pauVar40[0xc] = in_ZMM4;
        pauVar40[0xd] = in_ZMM3;
        pauVar40[0xe] = in_ZMM5;
        pauVar40[0xf] = auVar53;
        pauVar40 = pauVar40 + 0x10;
      }
      pvVar47 = (void *)((long)pvVar47 + lVar20);
      local_60 = (void *)((long)local_60 + lVar20);
      local_68 = (void *)((long)local_68 + lVar20);
      local_70 = (void *)((long)local_70 + lVar20);
      local_78 = (void *)((long)local_78 + lVar20);
      local_80 = (void *)((long)local_80 + lVar20);
      local_88 = (void *)((long)local_88 + lVar20);
      pvVar44 = (void *)((long)pvVar44 + lVar20);
      pvVar42 = (void *)((long)pvVar42 + lVar20);
      pvVar32 = (void *)((long)pvVar32 + lVar20);
      pvVar46 = (void *)((long)pvVar46 + lVar20);
      pvVar21 = (void *)((long)pvVar21 + lVar20);
      pvVar16 = (void *)((long)pvVar16 + lVar20);
      pvVar27 = (void *)((long)pvVar27 + lVar20);
      pvVar37 = (void *)((long)pvVar37 + lVar20);
      pvVar34 = (void *)((long)pvVar34 + lVar20);
      local_100 = local_100 + lVar20;
    }
    for (; (int)(uVar24 | 7) < (int)uVar12; uVar24 = uVar24 + 8) {
      pvVar17 = pvVar47;
      for (uVar22 = 0; uVar22 != uVar43; uVar22 = uVar22 + 1) {
        pvVar16 = pvVar17;
        for (lVar26 = 0; (int)lVar26 != 0x200; lVar26 = lVar26 + 0x40) {
          auVar53 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar16 + uVar22 * 4));
          *(undefined1 (*) [64])((long)*pauVar40 + lVar26) = auVar53;
          pvVar16 = (void *)((long)pvVar16 + lVar2);
        }
        pvVar17 = (void *)((long)pvVar17 + 4);
        pauVar40 = (undefined1 (*) [64])((long)*pauVar40 + lVar26);
      }
      pvVar47 = (void *)((long)pvVar47 + lVar25);
      local_100 = local_100 + lVar25;
    }
    for (; (int)(uVar24 | 3) < (int)uVar12; uVar24 = uVar24 + 4) {
      pvVar17 = pvVar47;
      for (uVar22 = 0; uVar22 != uVar43; uVar22 = uVar22 + 1) {
        pvVar16 = pvVar17;
        for (lVar26 = 0; (int)lVar26 != 0x100; lVar26 = lVar26 + 0x40) {
          auVar53 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar16 + uVar22 * 4));
          *(undefined1 (*) [64])((long)*pauVar40 + lVar26) = auVar53;
          pvVar16 = (void *)((long)pvVar16 + lVar2);
        }
        pvVar17 = (void *)((long)pvVar17 + 4);
        pauVar40 = (undefined1 (*) [64])((long)*pauVar40 + lVar26);
      }
      pvVar47 = (void *)((long)pvVar47 + lVar31);
      local_100 = local_100 + lVar31;
    }
    for (; (int)(uVar24 | 1) < (int)uVar12; uVar24 = uVar24 + 2) {
      for (lVar26 = 0; lVar1 - lVar26 != 0; lVar26 = lVar26 + 4) {
        auVar53 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar47 + lVar26) * 5));
        *pauVar40 = auVar53;
        auVar53 = vgatherdps_avx512f(*(undefined4 *)((local_100 + lVar26) * 5));
        pauVar40[1] = auVar53;
        pauVar40 = pauVar40 + 2;
      }
      pvVar47 = (void *)((long)pvVar47 + lVar15);
      local_100 = local_100 + lVar15;
    }
    for (; (int)uVar24 < (int)uVar12; uVar24 = uVar24 + 1) {
      for (lVar26 = 0; lVar1 - lVar26 != 0; lVar26 = lVar26 + 4) {
        auVar53 = vgatherdps_avx512f(*(undefined4 *)(((long)pvVar47 + lVar26) * 5));
        *pauVar40 = auVar53;
        pauVar40 = pauVar40 + 1;
      }
    }
    iVar14 = iVar14 + uVar36;
    iVar33 = iVar33 + uVar36;
    uVar18 = uVar18 + uVar36;
    iVar45 = iVar45 + uVar36;
    iVar39 = iVar39 + uVar36;
    iVar28 = iVar28 + uVar36;
    iVar41 = iVar41 + uVar36;
    local_f8 = local_f8 + uVar36;
    iVar19 = iVar19 + uVar36;
    iVar13 = iVar13 + uVar36;
    uVar29 = uVar29 + uVar36;
    local_90 = local_90 + uVar36;
    local_94 = local_94 + uVar36;
    local_98 = local_98 + uVar36;
    local_9c = local_9c + uVar36;
    iVar30 = iVar30 + uVar36;
    uVar24 = uVar36;
  }
  auVar51 = vpbroadcastd_avx512vl();
  auVar51 = vpmulld_avx2(auVar51,_DAT_00548600);
  auVar52 = vpbroadcastd_avx512vl();
  vpmulld_avx2(auVar52,auVar51);
  iVar13 = uVar3 * uVar12 * 8;
  for (; (long)(uVar23 | 7) < lVar38; uVar23 = uVar23 + 8) {
    pauVar40 = (undefined1 (*) [64])
               ((ulong)(((uint)(uVar23 >> 4) & 0xfffffff) + (uint)(((uint)uVar23 >> 3 & 1) != 0)) *
                (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize +
               (long)(this->weight_data_tm).data);
    pvVar17 = (this->super_Convolution1D).weight_data.data;
    pvVar32 = (void *)((long)iVar39 * 4 + (long)pvVar17);
    pvVar37 = (void *)((long)iVar28 * 4 + (long)pvVar17);
    pvVar34 = (void *)((long)iVar41 * 4 + (long)pvVar17);
    pvVar27 = (void *)((long)local_f8 * 4 + (long)pvVar17);
    pvVar47 = (void *)((long)(int)uVar18 * 4 + (long)pvVar17);
    pvVar21 = (void *)((long)iVar45 * 4 + (long)pvVar17);
    pvVar16 = (void *)((long)iVar33 * 4 + (long)pvVar17);
    pvVar17 = (void *)((long)pvVar17 + (long)iVar14 * 4);
    for (uVar24 = 0; (int)(uVar24 | 0xf) < (int)uVar12; uVar24 = uVar24 + 0x10) {
      for (lVar26 = 0; lVar1 - lVar26 != 0; lVar26 = lVar26 + 4) {
        auVar53 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar17 + lVar26 * 5));
        auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar16 + lVar26 * 5));
        auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar21 + lVar26 * 5));
        auVar56 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar47 + lVar26 * 5));
        auVar57 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar27 + lVar26 * 5));
        auVar58 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar34 + lVar26 * 5));
        auVar59 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar37 + lVar26 * 5));
        auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar32 + lVar26 * 5));
        auVar61 = vunpcklps_avx512f(auVar53,auVar54);
        auVar53 = vunpckhps_avx512f(auVar53,auVar54);
        auVar54 = vunpcklps_avx512f(auVar55,auVar56);
        auVar55 = vunpckhps_avx512f(auVar55,auVar56);
        auVar56 = vunpcklps_avx512f(auVar57,auVar58);
        auVar57 = vunpckhps_avx512f(auVar57,auVar58);
        auVar58 = vunpcklps_avx512f(auVar59,auVar60);
        auVar59 = vunpckhps_avx512f(auVar59,auVar60);
        auVar60 = vunpcklpd_avx512f(auVar61,auVar54);
        auVar54 = vunpckhpd_avx512f(auVar61,auVar54);
        auVar61 = vunpcklpd_avx512f(auVar53,auVar55);
        auVar53 = vunpckhpd_avx512f(auVar53,auVar55);
        auVar55 = vunpcklpd_avx512f(auVar56,auVar58);
        auVar56 = vunpckhpd_avx512f(auVar56,auVar58);
        auVar58 = vunpcklpd_avx512f(auVar57,auVar59);
        auVar57 = vunpckhpd_avx512f(auVar57,auVar59);
        auVar59 = vshuff64x2_avx512f(auVar60,auVar55,0x88);
        auVar62 = vshuff64x2_avx512f(auVar54,auVar56,0x88);
        auVar63 = vshuff64x2_avx512f(auVar61,auVar58,0x88);
        auVar64 = vshuff64x2_avx512f(auVar53,auVar57,0x88);
        in_ZMM5 = vshuff64x2_avx512f(auVar60,auVar55,0xdd);
        auVar54 = vshuff64x2_avx512f(auVar54,auVar56,0xdd);
        auVar55 = vshuff64x2_avx512f(auVar61,auVar58,0xdd);
        auVar53 = vshuff64x2_avx512f(auVar53,auVar57,0xdd);
        auVar56 = vshuff64x2_avx512f(auVar59,auVar62,0x88);
        auVar57 = vshuff64x2_avx512f(auVar63,auVar64,0x88);
        auVar58 = vshuff64x2_avx512f(in_ZMM5,auVar54,0x88);
        auVar60 = vshuff64x2_avx512f(auVar55,auVar53,0x88);
        auVar59 = vshuff64x2_avx512f(auVar59,auVar62,0xdd);
        auVar61 = vshuff64x2_avx512f(auVar63,auVar64,0xdd);
        in_ZMM4 = vshuff64x2_avx512f(in_ZMM5,auVar54,0xdd);
        in_ZMM3 = vshuff64x2_avx512f(auVar55,auVar53,0xdd);
        *pauVar40 = auVar56;
        pauVar40[1] = auVar57;
        pauVar40[2] = auVar58;
        pauVar40[3] = auVar60;
        pauVar40[4] = auVar59;
        pauVar40[5] = auVar61;
        pauVar40[6] = in_ZMM4;
        pauVar40[7] = in_ZMM3;
        pauVar40 = pauVar40 + 8;
      }
      pvVar17 = (void *)((long)pvVar17 + lVar20);
      pvVar16 = (void *)((long)pvVar16 + lVar20);
      pvVar21 = (void *)((long)pvVar21 + lVar20);
      pvVar47 = (void *)((long)pvVar47 + lVar20);
      pvVar27 = (void *)((long)pvVar27 + lVar20);
      pvVar34 = (void *)((long)pvVar34 + lVar20);
      pvVar37 = (void *)((long)pvVar37 + lVar20);
      pvVar32 = (void *)((long)pvVar32 + lVar20);
    }
    for (; (int)(uVar24 | 7) < (int)uVar12; uVar24 = uVar24 + 8) {
      for (lVar26 = 0; lVar1 - lVar26 != 0; lVar26 = lVar26 + 4) {
        auVar51 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
        auVar52 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar51);
        auVar51 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
        auVar77 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar51);
        auVar51 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
        auVar78 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar51);
        auVar51 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
        auVar79 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar51);
        auVar51 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
        auVar80 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar51);
        auVar51 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
        auVar81 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar51);
        auVar51 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
        auVar82 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar51);
        auVar51 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
        auVar84 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar51);
        auVar51 = vunpcklps_avx(auVar52,auVar77);
        auVar52 = vunpckhps_avx(auVar52,auVar77);
        auVar7 = vunpcklps_avx(auVar78,auVar79);
        auVar77 = vunpckhps_avx(auVar78,auVar79);
        auVar8 = vunpcklps_avx(auVar80,auVar81);
        auVar78 = vunpckhps_avx(auVar80,auVar81);
        auVar83 = vunpcklps_avx(auVar82,auVar84);
        auVar79 = vunpckhps_avx(auVar82,auVar84);
        auVar80 = vunpcklpd_avx(auVar51,auVar7);
        auVar51 = vunpckhpd_avx(auVar51,auVar7);
        auVar7 = vunpcklpd_avx(auVar52,auVar77);
        auVar52 = vunpckhpd_avx(auVar52,auVar77);
        auVar81 = vunpcklpd_avx(auVar8,auVar83);
        auVar77 = vunpckhpd_avx(auVar8,auVar83);
        auVar8 = vunpcklpd_avx(auVar78,auVar79);
        auVar78 = vunpckhpd_avx(auVar78,auVar79);
        auVar83._16_16_ = auVar81._0_16_;
        auVar83._0_16_ = auVar80._0_16_;
        auVar82._16_16_ = auVar77._0_16_;
        auVar82._0_16_ = auVar51._0_16_;
        auVar84._16_16_ = auVar8._0_16_;
        auVar84._0_16_ = auVar7._0_16_;
        auVar85._16_16_ = auVar78._0_16_;
        auVar85._0_16_ = auVar52._0_16_;
        auVar79 = vperm2f128_avx(auVar80,auVar81,0x31);
        auVar51 = vperm2f128_avx(auVar51,auVar77,0x31);
        in_ZMM3 = ZEXT3264(auVar51);
        auVar77 = vperm2f128_avx(auVar7,auVar8,0x31);
        in_ZMM5 = ZEXT3264(auVar77);
        auVar52 = vperm2f128_avx(auVar52,auVar78,0x31);
        in_ZMM4 = ZEXT3264(auVar52);
        *(undefined1 (*) [32])*pauVar40 = auVar83;
        *(undefined1 (*) [32])((long)*pauVar40 + 0x20) = auVar82;
        *(undefined1 (*) [32])pauVar40[1] = auVar84;
        *(undefined1 (*) [32])(pauVar40[1] + 0x20) = auVar85;
        *(undefined1 (*) [32])pauVar40[2] = auVar79;
        *(undefined1 (*) [32])(pauVar40[2] + 0x20) = auVar51;
        *(undefined1 (*) [32])pauVar40[3] = auVar77;
        *(undefined1 (*) [32])(pauVar40[3] + 0x20) = auVar52;
        pauVar40 = pauVar40 + 4;
      }
      pvVar47 = (void *)((long)pvVar47 + lVar25);
    }
    for (; (int)(uVar24 | 3) < (int)uVar12; uVar24 = uVar24 + 4) {
      for (uVar22 = 0; uVar22 != uVar43; uVar22 = uVar22 + 1) {
        for (pvVar47 = (void *)0x0; (int)pvVar47 != 0x80; pvVar47 = (void *)((long)pvVar47 + 0x20))
        {
          auVar51 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
          auVar51 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar51);
          in_ZMM4 = ZEXT3264(auVar51);
          in_ZMM3 = ZEXT3264((undefined1  [32])0x0);
          *(undefined1 (*) [32])((long)*pauVar40 + (long)pvVar47) = auVar51;
        }
        pauVar40 = (undefined1 (*) [64])((long)*pauVar40 + (long)pvVar47);
      }
    }
    for (; (int)(uVar24 | 1) < (int)uVar12; uVar24 = uVar24 + 2) {
      for (lVar26 = 0; lVar1 - lVar26 != 0; lVar26 = lVar26 + 4) {
        auVar51 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
        auVar51 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar51);
        *(undefined1 (*) [32])*pauVar40 = auVar51;
        auVar51 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
        auVar51 = vgatherdps(ZEXT832(0) << 0x20,auVar51);
        in_ZMM4 = ZEXT3264(auVar51);
        in_ZMM3 = ZEXT3264((undefined1  [32])0x0);
        *(undefined1 (*) [32])((long)*pauVar40 + 0x20) = auVar51;
        pauVar40 = pauVar40 + 1;
      }
    }
    for (; (int)uVar24 < (int)uVar12; uVar24 = uVar24 + 1) {
      for (lVar26 = 0; lVar1 - lVar26 != 0; lVar26 = lVar26 + 4) {
        auVar51 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
        auVar51 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar51);
        in_ZMM4 = ZEXT3264(auVar51);
        in_ZMM3 = ZEXT3264((undefined1  [32])0x0);
        *(undefined1 (*) [32])*pauVar40 = auVar51;
        pauVar40 = (undefined1 (*) [64])((long)*pauVar40 + 0x20);
      }
    }
    iVar14 = iVar14 + iVar13;
    iVar33 = iVar33 + iVar13;
    uVar18 = uVar18 + iVar13;
    iVar45 = iVar45 + iVar13;
    iVar39 = iVar39 + iVar13;
    iVar28 = iVar28 + iVar13;
    iVar41 = iVar41 + iVar13;
    local_f8 = local_f8 + iVar13;
  }
  auVar49 = vpbroadcastd_avx512vl();
  auVar49 = vpmulld_avx(auVar49,_DAT_00547290);
  auVar50 = vpbroadcastd_avx512vl();
  auVar49 = vpmulld_avx(auVar50,auVar49);
  auVar53 = ZEXT1664(auVar49);
  iVar41 = uVar3 * uVar12 * 4;
  for (; uVar22 = (ulong)uVar18, (long)(uVar23 | 3) < lVar38; uVar23 = uVar23 + 4) {
    pauVar40 = (undefined1 (*) [64])
               ((ulong)(((uint)(uVar23 >> 3) & 1) + ((uint)(uVar23 >> 4) & 0xfffffff) +
                       (uint)(((uint)uVar23 >> 2 & 1) != 0)) * (this->weight_data_tm).cstep *
                (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
    pvVar17 = (this->super_Convolution1D).weight_data.data;
    pvVar16 = (void *)((long)(int)uVar18 * 4 + (long)pvVar17);
    pvVar21 = (void *)((long)iVar45 * 4 + (long)pvVar17);
    pvVar47 = (void *)((long)iVar33 * 4 + (long)pvVar17);
    pvVar17 = (void *)((long)pvVar17 + (long)iVar14 * 4);
    for (uVar24 = 0; (int)(uVar24 | 0xf) < (int)uVar12; uVar24 = uVar24 + 0x10) {
      for (lVar26 = 0; lVar1 - lVar26 != 0; lVar26 = lVar26 + 4) {
        auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar17 + (long)pvVar16 * 4 + lVar26));
        auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar47 + (long)pvVar16 * 4 + lVar26));
        auVar56 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar21 + (long)pvVar16 * 4 + lVar26));
        auVar57 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar16 * 5 + lVar26));
        auVar58 = vunpcklps_avx512f(auVar54,auVar55);
        auVar54 = vunpckhps_avx512f(auVar54,auVar55);
        auVar55 = vunpcklps_avx512f(auVar56,auVar57);
        auVar56 = vunpckhps_avx512f(auVar56,auVar57);
        auVar57 = vunpcklpd_avx512f(auVar58,auVar55);
        auVar55 = vunpckhpd_avx512f(auVar58,auVar55);
        auVar58 = vunpcklpd_avx512f(auVar54,auVar56);
        auVar54 = vunpckhpd_avx512f(auVar54,auVar56);
        auVar56 = vshuff64x2_avx512f(auVar57,auVar55,0x88);
        auVar59 = vshuff64x2_avx512f(auVar58,auVar54,0x88);
        in_ZMM5 = vshuff64x2_avx512f(auVar57,auVar55,0xdd);
        auVar54 = vshuff64x2_avx512f(auVar58,auVar54,0xdd);
        auVar55 = vshuff64x2_avx512f(auVar56,auVar59,0x88);
        auVar57 = vshuff64x2_avx512f(in_ZMM5,auVar54,0x88);
        auVar56 = vshuff64x2_avx512f(auVar56,auVar59,0xdd);
        in_ZMM4 = vshuff64x2_avx512f(in_ZMM5,auVar54,0xdd);
        *pauVar40 = auVar55;
        pauVar40[1] = auVar57;
        pauVar40[2] = auVar56;
        pauVar40[3] = in_ZMM4;
        pauVar40 = pauVar40 + 4;
      }
      pvVar17 = (void *)((long)pvVar17 + lVar20);
      pvVar47 = (void *)((long)pvVar47 + lVar20);
      pvVar21 = (void *)((long)pvVar21 + lVar20);
      pvVar16 = (void *)((long)pvVar16 + lVar20);
    }
    for (; (int)(uVar24 | 7) < (int)uVar12; uVar24 = uVar24 + 8) {
      for (lVar26 = 0; lVar1 - lVar26 != 0; lVar26 = lVar26 + 4) {
        auVar51 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
        auVar52 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar51);
        auVar51 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
        auVar77 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar51);
        auVar51 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
        auVar78 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar51);
        auVar51 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
        auVar80 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar51);
        auVar51 = vunpcklps_avx(auVar52,auVar77);
        auVar52 = vunpckhps_avx(auVar52,auVar77);
        auVar79 = vunpcklps_avx(auVar78,auVar80);
        auVar77 = vunpckhps_avx(auVar78,auVar80);
        auVar78 = vunpcklpd_avx(auVar51,auVar79);
        auVar51 = vunpckhpd_avx(auVar51,auVar79);
        auVar79 = vunpcklpd_avx(auVar52,auVar77);
        auVar52 = vunpckhpd_avx(auVar52,auVar77);
        auVar77._16_16_ = auVar51._0_16_;
        auVar77._0_16_ = auVar78._0_16_;
        auVar80._16_16_ = auVar52._0_16_;
        auVar80._0_16_ = auVar79._0_16_;
        auVar51 = vperm2f128_avx(auVar78,auVar51,0x31);
        in_ZMM4 = ZEXT3264(auVar51);
        auVar52 = vperm2f128_avx(auVar79,auVar52,0x31);
        in_ZMM5 = ZEXT3264(auVar52);
        *(undefined1 (*) [32])*pauVar40 = auVar77;
        *(undefined1 (*) [32])((long)*pauVar40 + 0x20) = auVar80;
        *(undefined1 (*) [32])pauVar40[1] = auVar51;
        *(undefined1 (*) [32])(pauVar40[1] + 0x20) = auVar52;
        pauVar40 = pauVar40 + 2;
      }
      pvVar47 = (void *)((long)pvVar47 + lVar25);
    }
    for (; (int)(uVar24 | 3) < (int)uVar12; uVar24 = uVar24 + 4) {
      for (lVar26 = 0; lVar1 - lVar26 != 0; lVar26 = lVar26 + 4) {
        auVar49 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
        auVar9 = vgatherdps(ZEXT816(0) << 0x40,auVar49);
        auVar49 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
        auVar10 = vgatherdps(ZEXT816(0) << 0x40,auVar49);
        auVar49 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
        auVar11 = vgatherdps(ZEXT816(0) << 0x40,auVar49);
        auVar49 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
        auVar49 = vgatherdps(ZEXT816(0) << 0x40,auVar49);
        auVar50 = vunpcklps_avx(auVar9,auVar10);
        auVar6 = vunpcklps_avx(auVar11,auVar49);
        auVar9 = vunpckhps_avx(auVar9,auVar10);
        auVar10 = vunpckhps_avx(auVar11,auVar49);
        auVar49 = vmovlhps_avx(auVar50,auVar6);
        auVar6 = vunpckhpd_avx(auVar50,auVar6);
        in_ZMM4 = ZEXT1664(auVar6);
        auVar50 = vmovlhps_avx(auVar9,auVar10);
        auVar9 = vunpckhpd_avx(auVar9,auVar10);
        in_ZMM5 = ZEXT1664(auVar9);
        *(undefined1 (*) [16])*pauVar40 = auVar49;
        *(undefined1 (*) [16])((long)*pauVar40 + 0x10) = auVar6;
        *(undefined1 (*) [16])((long)*pauVar40 + 0x20) = auVar50;
        *(undefined1 (*) [16])((long)*pauVar40 + 0x30) = auVar9;
        pauVar40 = pauVar40 + 1;
      }
      pvVar47 = (void *)((long)pvVar47 + lVar31);
    }
    for (; (int)(uVar24 | 1) < (int)uVar12; uVar24 = uVar24 + 2) {
      for (lVar26 = 0; lVar1 - lVar26 != 0; lVar26 = lVar26 + 4) {
        auVar49 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
        auVar49 = vgatherdps(ZEXT816(0) << 0x40,auVar49);
        *(undefined1 (*) [16])*pauVar40 = auVar49;
        auVar49 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
        auVar49 = vgatherdps(ZEXT816(0) << 0x20,auVar49);
        in_ZMM5 = ZEXT1664(auVar49);
        in_ZMM4 = ZEXT1664((undefined1  [16])0x0);
        *(undefined1 (*) [16])((long)*pauVar40 + 0x10) = auVar49;
        pauVar40 = (undefined1 (*) [64])((long)*pauVar40 + 0x20);
      }
    }
    for (; (int)uVar24 < (int)uVar12; uVar24 = uVar24 + 1) {
      for (lVar26 = 0; lVar1 - lVar26 != 0; lVar26 = lVar26 + 4) {
        auVar49 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
        auVar49 = vgatherdps(ZEXT816(0) << 0x40,auVar49);
        in_ZMM5 = ZEXT1664(auVar49);
        in_ZMM4 = ZEXT1664((undefined1  [16])0x0);
        *(undefined1 (*) [16])*pauVar40 = auVar49;
        pauVar40 = (undefined1 (*) [64])((long)*pauVar40 + 0x10);
      }
    }
    iVar14 = iVar14 + iVar41;
    iVar33 = iVar33 + iVar41;
    uVar18 = uVar18 + iVar41;
    iVar45 = iVar45 + iVar41;
  }
  uVar18 = uVar3 * uVar12 * 2;
  for (; pvVar17 = (void *)(uVar23 | 1), (long)pvVar17 < lVar38; uVar23 = uVar23 + 2) {
    pauVar40 = (undefined1 (*) [64])
               ((ulong)(((uint)(uVar23 >> 2) & 1) +
                        ((uint)(uVar23 >> 4) & 0xfffffff) + (uint)(((uint)uVar23 >> 3 & 1) != 0) +
                       (uint)(((uint)uVar23 >> 1 & 1) != 0)) * (this->weight_data_tm).cstep *
                (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
    pvVar47 = (this->super_Convolution1D).weight_data.data;
    pvVar17 = (void *)((long)iVar33 * 4 + (long)pvVar47);
    pvVar47 = (void *)((long)iVar14 * 4 + (long)pvVar47);
    for (uVar24 = 0; (int)(uVar24 | 0xf) < (int)uVar12; uVar24 = uVar24 + 0x10) {
      for (lVar26 = 0; lVar1 - lVar26 != 0; lVar26 = lVar26 + 4) {
        auVar53 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar47 + (ulong)uVar18 * 4 + lVar26));
        in_ZMM4 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar17 + (ulong)uVar18 * 4 + lVar26));
        *pauVar40 = auVar53;
        pauVar40[1] = in_ZMM4;
        pauVar40 = pauVar40 + 2;
      }
      pvVar47 = (void *)((long)pvVar47 + lVar20);
      pvVar17 = (void *)((long)pvVar17 + lVar20);
    }
    for (; (int)(uVar24 | 7) < (int)uVar12; uVar24 = uVar24 + 8) {
      for (lVar26 = 0; lVar1 - lVar26 != 0; lVar26 = lVar26 + 4) {
        auVar51 = vpcmpeqd_avx2(auVar53._0_32_,auVar53._0_32_);
        auVar52 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar51);
        in_ZMM4 = ZEXT3264(auVar52);
        auVar51 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
        auVar51 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar51);
        in_ZMM5 = ZEXT3264(auVar51);
        auVar53 = ZEXT3264((undefined1  [32])0x0);
        *(undefined1 (*) [32])*pauVar40 = auVar52;
        *(undefined1 (*) [32])((long)*pauVar40 + 0x20) = auVar51;
        pauVar40 = pauVar40 + 1;
      }
      pvVar47 = (void *)((long)pvVar47 + lVar25);
      pvVar17 = (void *)((long)pvVar17 + lVar25);
    }
    for (; (int)(uVar24 | 3) < (int)uVar12; uVar24 = uVar24 + 4) {
      for (lVar26 = 0; lVar1 - lVar26 != 0; lVar26 = lVar26 + 4) {
        auVar49 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
        auVar50 = vgatherdps((undefined1  [16])0x0,auVar49);
        auVar53 = ZEXT1664(auVar50);
        auVar49 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
        auVar49 = vgatherdps((undefined1  [16])0x0,auVar49);
        in_ZMM4 = ZEXT1664(auVar49);
        in_ZMM5 = ZEXT1664((undefined1  [16])0x0);
        *(undefined1 (*) [16])*pauVar40 = auVar50;
        *(undefined1 (*) [16])((long)*pauVar40 + 0x10) = auVar49;
        pauVar40 = (undefined1 (*) [64])((long)*pauVar40 + 0x20);
      }
      pvVar47 = (void *)((long)pvVar47 + lVar31);
      pvVar17 = (void *)((long)pvVar17 + lVar31);
    }
    for (; uVar22 = (ulong)(uVar24 | 1), (int)(uVar24 | 1) < (int)uVar12; uVar24 = uVar24 + 2) {
      pvVar16 = pvVar17;
      pvVar21 = pvVar47;
      for (uVar22 = 0; uVar22 != uVar43; uVar22 = uVar22 + 1) {
        lVar48 = 0;
        for (lVar26 = 0; (int)lVar26 != 0x10; lVar26 = lVar26 + 8) {
          *(undefined4 *)((long)*pauVar40 + lVar26) = *(undefined4 *)((long)pvVar21 + lVar48);
          auVar53 = ZEXT464(*(uint *)((long)pvVar16 + lVar48));
          *(uint *)((long)*pauVar40 + lVar26 + 4) = *(uint *)((long)pvVar16 + lVar48);
          lVar48 = lVar48 + lVar2;
        }
        pauVar40 = (undefined1 (*) [64])((long)*pauVar40 + lVar26);
        pvVar21 = (void *)((long)pvVar21 + 4);
        pvVar16 = (void *)((long)pvVar16 + 4);
      }
      pvVar47 = (void *)((long)pvVar47 + lVar15);
      pvVar17 = (void *)((long)pvVar17 + lVar15);
    }
    for (; (int)uVar24 < (int)uVar12; uVar24 = uVar24 + 1) {
      for (uVar22 = 0; uVar43 != uVar22; uVar22 = uVar22 + 1) {
        *(undefined4 *)*pauVar40 = *(undefined4 *)((long)pvVar47 + uVar22 * 4);
        uVar29 = *(uint *)((long)pvVar17 + uVar22 * 4);
        auVar53 = ZEXT464(uVar29);
        *(uint *)((long)*pauVar40 + 4) = uVar29;
        pauVar40 = (undefined1 (*) [64])((long)*pauVar40 + 8);
      }
    }
    iVar14 = iVar14 + uVar18;
    iVar33 = iVar33 + uVar18;
  }
  for (; (long)uVar23 < lVar38; uVar23 = uVar23 + 1) {
    pvVar47 = (this->super_Convolution1D).weight_data.data;
    uVar18 = (uint)uVar23;
    pauVar40 = (undefined1 (*) [64])
               ((ulong)((uVar18 & 1) + ((uint)(uVar23 >> 4) & 0xfffffff) +
                        (uint)((uVar18 >> 3 & 1) != 0) + ((uint)(uVar23 >> 2) & 1) +
                       (uint)((uVar18 >> 1 & 1) != 0)) * (this->weight_data_tm).cstep *
                (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
    pvVar17 = (void *)((long)pvVar47 + (long)iVar14 * 4);
    lVar26 = (long)iVar14 * 4 + lVar2 + (long)pvVar47;
    uVar22 = uVar23;
    for (pvVar47 = (void *)0x0; (int)((uint)pvVar47 | 0xf) < (int)uVar12;
        pvVar47 = (void *)(ulong)((uint)pvVar47 + 0x10)) {
      for (lVar48 = 0; lVar1 - lVar48 != 0; lVar48 = lVar48 + 4) {
        uVar22 = (long)pvVar17 + lVar48;
        auVar53 = vgatherdps_avx512f(*(undefined4 *)(uVar22 + (long)pauVar40 * 4));
        *pauVar40 = auVar53;
        pauVar40 = pauVar40 + 1;
      }
      pvVar17 = (void *)((long)pvVar17 + lVar20);
      lVar26 = lVar26 + lVar20;
    }
    for (; (int)((uint)pvVar47 | 7) < (int)uVar12; pvVar47 = (void *)(ulong)((uint)pvVar47 + 8)) {
      for (lVar48 = 0; lVar1 - lVar48 != 0; lVar48 = lVar48 + 4) {
        uVar22 = (long)pvVar17 + lVar48;
        auVar51 = vpcmpeqd_avx2(auVar53._0_32_,auVar53._0_32_);
        auVar51 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar51);
        auVar53 = ZEXT3264((undefined1  [32])0x0);
        *(undefined1 (*) [32])*pauVar40 = auVar51;
        pauVar40 = (undefined1 (*) [64])((long)*pauVar40 + 0x20);
      }
      pvVar17 = (void *)((long)pvVar17 + lVar25);
      lVar26 = lVar26 + lVar25;
    }
    for (; (int)((uint)pvVar47 | 3) < (int)uVar12; pvVar47 = (void *)(ulong)((uint)pvVar47 + 4)) {
      for (lVar48 = 0; lVar1 - lVar48 != 0; lVar48 = lVar48 + 4) {
        uVar22 = (long)pvVar17 + lVar48;
        auVar49 = vpcmpeqd_avx(auVar53._0_16_,auVar53._0_16_);
        auVar49 = vgatherdps(ZEXT816(0) << 0x40,auVar49);
        auVar53 = ZEXT1664((undefined1  [16])0x0);
        *(undefined1 (*) [16])*pauVar40 = auVar49;
        pauVar40 = (undefined1 (*) [64])((long)*pauVar40 + 0x10);
      }
      pvVar17 = (void *)((long)pvVar17 + lVar31);
      lVar26 = lVar26 + lVar31;
    }
    for (; (int)((uint)pvVar47 | 1) < (int)uVar12; pvVar47 = (void *)(ulong)((uint)pvVar47 + 2)) {
      for (uVar35 = 0; uVar43 != uVar35; uVar35 = uVar35 + 1) {
        *(undefined4 *)*pauVar40 = *(undefined4 *)((long)pvVar17 + uVar35 * 4);
        uVar18 = *(uint *)(lVar26 + uVar35 * 4);
        auVar53 = ZEXT464(uVar18);
        *(uint *)((long)*pauVar40 + 4) = uVar18;
        pauVar40 = (undefined1 (*) [64])((long)*pauVar40 + 8);
      }
      pvVar17 = (void *)((long)pvVar17 + lVar15);
      lVar26 = lVar26 + lVar15;
    }
    for (; (int)pvVar47 < (int)uVar12; pvVar47 = (void *)(ulong)((int)pvVar47 + 1)) {
      for (lVar26 = 0; lVar1 - lVar26 != 0; lVar26 = lVar26 + 4) {
        auVar53 = ZEXT464(*(uint *)((long)pvVar17 + lVar26));
        *(uint *)((long)*pauVar40 + lVar26) = *(uint *)((long)pvVar17 + lVar26);
      }
      pauVar40 = (undefined1 (*) [64])((long)*pauVar40 + lVar26);
    }
    iVar14 = iVar14 + uVar3 * uVar12;
  }
  if (opt->lightmode == true) {
    piVar4 = (this->super_Convolution1D).weight_data.refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar16 = (this->super_Convolution1D).weight_data.data;
        pAVar5 = (this->super_Convolution1D).weight_data.allocator;
        if (pAVar5 == (Allocator *)0x0) {
          free(pvVar16);
        }
        else {
          (*pAVar5->_vptr_Allocator[3])(pAVar5,pvVar16,pvVar47,pvVar17,uVar22);
        }
      }
    }
    (this->super_Convolution1D).weight_data.cstep = 0;
    *(undefined1 (*) [16])((long)&(this->super_Convolution1D).weight_data.refcount + 4) =
         (undefined1  [16])0x0;
    (this->super_Convolution1D).weight_data.data = (void *)0x0;
    (this->super_Convolution1D).weight_data.refcount = (int *)0x0;
    (this->super_Convolution1D).weight_data.dims = 0;
    (this->super_Convolution1D).weight_data.w = 0;
    (this->super_Convolution1D).weight_data.h = 0;
    (this->super_Convolution1D).weight_data.d = 0;
    (this->super_Convolution1D).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution1D_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    convolution1d_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}